

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall randomx::JitCompilerX86::JitCompilerX86(JitCompilerX86 *this)

{
  uint uVar1;
  uint8_t *__dest;
  uint uVar2;
  Cpu cpu;
  Cpu CStack_28;
  
  (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Cpu::Cpu(&CStack_28);
  if ((CONCAT53(CStack_28.manufacturer_string._8_5_,CStack_28.manufacturer_string[1]._1_3_) ==
       0x6c65746e49656e &&
       CONCAT35(CStack_28.manufacturer_string[1]._1_3_,CStack_28.manufacturer_string._0_5_) ==
       0x49656e69756e6547) && ((CStack_28.field_4.processor_info_data & 0xf00U) == 0x600)) {
    uVar2 = (uint)CStack_28.field_4.processor_info_data >> 0xc & 0xf0 |
            (uint)CStack_28.field_4.processor_info_data >> 4 & 0xf;
    uVar1 = CStack_28.field_4.processor_info_data & 0xf;
    BranchesWithin32B = 1;
    if (uVar2 != 0x4e || (uVar1 ^ 3) != 0) {
      if ((((uVar1 != 4 || uVar2 != 0x55) && ((uVar1 ^ 3) != 0 || uVar2 != 0x5e)) &&
          (3 < uVar1 - 9 || uVar2 != 0x8e)) &&
         ((4 < uVar1 - 9 || uVar2 != 0x9e && (uVar2 != 0xa6 || uVar1 != 0)))) {
        BranchesWithin32B = uVar1 == 10 && uVar2 == 0xae;
      }
    }
  }
  __dest = (uint8_t *)allocMemoryPages(0x13000);
  this->code = __dest;
  memcpy(__dest,codePrologue,(long)prologueSize);
  memcpy(this->code + epilogueOffset,codeEpilogue,(long)epilogueSize);
  return;
}

Assistant:

JitCompilerX86::JitCompilerX86() {
		// CPU-specific tweaks
		Cpu cpu;
		if (strcmp(cpu.manufacturer(), "GenuineIntel") == 0) {
			Cpu::ProcessorInfo info = cpu.processorInfo();

			// Intel JCC erratum mitigation
			if (info.family == 6) {
				const uint32_t model = info.model | (info.ext_model << 4);
				const uint32_t stepping = info.stepping;

				// Affected CPU models and stepping numbers are taken from https://www.intel.com/content/dam/support/us/en/documents/processors/mitigations-jump-conditional-code-erratum.pdf
				BranchesWithin32B =
					((model == 0x4E) && (stepping == 0x3)) ||
					((model == 0x55) && (stepping == 0x4)) ||
					((model == 0x5E) && (stepping == 0x3)) ||
					((model == 0x8E) && (stepping >= 0x9) && (stepping <= 0xC)) ||
					((model == 0x9E) && (stepping >= 0x9) && (stepping <= 0xD)) ||
					((model == 0xA6) && (stepping == 0x0)) ||
					((model == 0xAE) && (stepping == 0xA));
			}
		}

		code = (uint8_t*)allocMemoryPages(CodeSize);
		memcpy(code, codePrologue, prologueSize);
		memcpy(code + epilogueOffset, codeEpilogue, epilogueSize);
	}